

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2p.cpp
# Opt level: O0

void __thiscall i2p::sam::Session::CreateIfNotCreatedAlready(Session *this)

{
  Span<const_unsigned_char> input;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  pointer pSVar4;
  char *__a;
  type_conflict3 *ptVar5;
  long in_RDI;
  long in_FS_OFFSET;
  string *private_key_b64;
  type *data;
  type *read_ok;
  Reply *reply;
  unique_ptr<Sock,_std::default_delete<Sock>_> sock;
  char *session_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> session_id;
  string errmsg;
  undefined4 in_stack_fffffffffffffb28;
  undefined2 in_stack_fffffffffffffb2c;
  uint16_t in_stack_fffffffffffffb2e;
  char *in_stack_fffffffffffffb30;
  CService *in_stack_fffffffffffffb38;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  string *in_stack_fffffffffffffb68;
  Session *in_stack_fffffffffffffb70;
  allocator<char> *__s;
  undefined7 in_stack_fffffffffffffb78;
  undefined1 in_stack_fffffffffffffb7f;
  string *in_stack_fffffffffffffb80;
  Session *in_stack_fffffffffffffb88;
  Session *in_stack_fffffffffffffb90;
  size_t in_stack_fffffffffffffb98;
  int source_line;
  string *in_stack_fffffffffffffba0;
  ConstevalFormatString<3U> in_stack_fffffffffffffbd8;
  char *fmt;
  undefined1 *in_stack_fffffffffffffbe0;
  const_iterator in_stack_fffffffffffffbe8;
  const_iterator in_stack_fffffffffffffbf0;
  type *in_stack_fffffffffffffbf8;
  allocator<char> local_3c1 [16];
  undefined1 in_stack_fffffffffffffc4f;
  string *in_stack_fffffffffffffc50;
  Sock *in_stack_fffffffffffffc58;
  Session *in_stack_fffffffffffffc60;
  allocator<char> local_371 [65];
  undefined4 level;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcf0;
  CService local_2e8 [7];
  undefined1 local_1c8 [288];
  basic_string_view<char,_std::char_traits<char>_> local_a8 [6];
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb40._M_current);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                     CONCAT26(in_stack_fffffffffffffb2e,
                              CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
  if (bVar1) {
    pSVar4 = std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator->
                       ((unique_ptr<Sock,_std::default_delete<Sock>_> *)
                        CONCAT26(in_stack_fffffffffffffb2e,
                                 CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
    uVar3 = (*pSVar4->_vptr_Sock[0x13])(pSVar4,&stack0xffffffffffffffd8);
    if ((uVar3 & 1) != 0) goto LAB_00910024;
  }
  __a = "persistent";
  if ((*(byte *)(in_RDI + 0x110) & 1) != 0) {
    __a = "transient";
  }
  GetRandHash();
  base_blob<256u>::GetHex_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffb40._M_current);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48._M_current,
             (size_type)in_stack_fffffffffffffb40._M_current);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT26(in_stack_fffffffffffffb2e,
                      CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
  bVar1 = ::LogAcceptCategory(CONCAT26(in_stack_fffffffffffffb2e,
                                       CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)
                                      ),Trace);
  if (bVar1) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               in_stack_fffffffffffffb48._M_current,in_stack_fffffffffffffb40._M_current);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               in_stack_fffffffffffffb48._M_current,in_stack_fffffffffffffb40._M_current);
    Proxy::ToString_abi_cxx11_((Proxy *)in_stack_fffffffffffffb40._M_current);
    in_stack_fffffffffffffb48._M_current = (char *)local_a8;
    in_stack_fffffffffffffb40._M_current = &stack0xffffffffffffffb8;
    in_stack_fffffffffffffb38 = (CService *)&stack0xfffffffffffffcd0;
    in_stack_fffffffffffffb30 = "Creating %s SAM session %s with %s\n";
    in_stack_fffffffffffffb28 = 1;
    logging_function._M_str = (char *)in_stack_fffffffffffffbf8;
    logging_function._M_len = (size_t)in_stack_fffffffffffffbf0._M_current;
    source_file._M_str = in_stack_fffffffffffffbe8._M_current;
    source_file._M_len = (size_t)in_stack_fffffffffffffbe0;
    LogPrintFormatInternal<char_const*,std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,(int)(in_stack_fffffffffffffb98 >> 0x20),
               (LogFlags)in_stack_fffffffffffffb90,(int)__a,in_stack_fffffffffffffbd8,
               (char **)in_stack_fffffffffffffce0,in_stack_fffffffffffffce8,
               in_stack_fffffffffffffcf0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffb2e,
                        CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
  }
  Hello(in_stack_fffffffffffffb70);
  if ((*(byte *)(in_RDI + 0x110) & 1) == 0) {
    std::numeric_limits<unsigned_long>::max();
    ReadBinaryFile_abi_cxx11_((path *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    source_line = (int)(in_stack_fffffffffffffb98 >> 0x20);
    ptVar5 = std::get<0ul,bool,std::__cxx11::string>
                       ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)CONCAT26(in_stack_fffffffffffffb2e,
                                    CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
    in_stack_fffffffffffffbf8 =
         std::get<1ul,bool,std::__cxx11::string>
                   ((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)CONCAT26(in_stack_fffffffffffffb2e,
                                CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
    if ((*ptVar5 & 1U) == 0) {
      in_stack_fffffffffffffb90 =
           (Session *)
           std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator*
                     ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffb38);
      GenerateAndSavePrivateKey(in_stack_fffffffffffffb90,(Sock *)in_stack_fffffffffffffb88);
    }
    else {
      source_line = (int)((ulong)(in_RDI + 0xa8) >> 0x20);
      in_stack_fffffffffffffbf0 =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT26(in_stack_fffffffffffffb2e,
                               CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
      in_stack_fffffffffffffbe8 =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffb38);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT26(in_stack_fffffffffffffb2e,
                          CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)),
                 in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
    }
    Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffffb38,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb30,
               (type)CONCAT26(in_stack_fffffffffffffb2e,
                              CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
    input.m_size = (size_t)in_stack_fffffffffffffb88;
    input.m_data = (uchar *)in_stack_fffffffffffffb80;
    EncodeBase64_abi_cxx11_(input);
    SwapBase64(in_stack_fffffffffffffba0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffb2e,
                        CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
    in_stack_fffffffffffffbe0 = local_1c8;
    in_stack_fffffffffffffb88 =
         (Session *)
         std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator*
                   ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffb38);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              ((char *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60,in_stack_fffffffffffffb58
              );
    SendRequestAndGetReply
              (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
               (bool)in_stack_fffffffffffffc4f);
    Reply::~Reply((Reply *)CONCAT26(in_stack_fffffffffffffb2e,
                                    CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffb2e,
                        CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffb2e,
                        CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
    std::
    pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~pair((pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)CONCAT26(in_stack_fffffffffffffb2e,
                      CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
  }
  else {
    std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator*
              ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffb38);
    source_line = (int)(in_stack_fffffffffffffb98 >> 0x20);
    tinyformat::format<std::__cxx11::string>
              ((char *)in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
    SendRequestAndGetReply
              (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
               (bool)in_stack_fffffffffffffc4f);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffb2e,
                        CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb7f,in_stack_fffffffffffffb78),
               (char *)in_stack_fffffffffffffb70,(allocator<char> *)in_stack_fffffffffffffb68);
    Reply::Get((Reply *)in_stack_fffffffffffffb70,in_stack_fffffffffffffb68);
    DecodeI2PBase64(in_stack_fffffffffffffb80);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb38,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb30);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb38);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffb2e,
                        CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffb2e,
                        CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
    std::allocator<char>::~allocator(local_371);
    Reply::~Reply((Reply *)CONCAT26(in_stack_fffffffffffffb2e,
                                    CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
  }
  MyDestination(in_stack_fffffffffffffb88);
  DestBinToAddr((Binary *)in_stack_fffffffffffffb80);
  CService::CService(in_stack_fffffffffffffb38,(CNetAddr *)in_stack_fffffffffffffb30,
                     in_stack_fffffffffffffb2e);
  CService::operator=(in_stack_fffffffffffffb38,(CService *)in_stack_fffffffffffffb30);
  CService::~CService((CService *)
                      CONCAT26(in_stack_fffffffffffffb2e,
                               CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
  CNetAddr::~CNetAddr((CNetAddr *)
                      CONCAT26(in_stack_fffffffffffffb2e,
                               CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffb30);
  std::unique_ptr<Sock,_std::default_delete<Sock>_>::operator=
            ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffb38,
             (unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffb30);
  uVar2 = ::LogAcceptCategory(CONCAT26(in_stack_fffffffffffffb2e,
                                       CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)
                                      ),Trace);
  if ((bool)uVar2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               in_stack_fffffffffffffb48._M_current,in_stack_fffffffffffffb40._M_current);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               in_stack_fffffffffffffb48._M_current,in_stack_fffffffffffffb40._M_current);
    fmt = "%s SAM session %s created, my address=%s\n";
    __s = local_3c1;
    uVar6 = __a;
    std::allocator<char>::allocator();
    level = (undefined4)uVar6;
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_fffffffffffffb78),(char *)__s,(allocator<char> *)__a);
    Capitalize((string *)in_stack_fffffffffffffb40._M_current);
    CService::ToStringAddrPort_abi_cxx11_((CService *)(in_RDI + 0xf0));
    in_stack_fffffffffffffb38 = local_2e8;
    in_stack_fffffffffffffb28 = 2;
    logging_function_00._M_str = (char *)in_stack_fffffffffffffbf8;
    logging_function_00._M_len = (size_t)in_stack_fffffffffffffbf0._M_current;
    source_file_00._M_str = in_stack_fffffffffffffbe8._M_current;
    source_file_00._M_len = (size_t)in_stack_fffffffffffffbe0;
    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (logging_function_00,source_file_00,source_line,(LogFlags)in_stack_fffffffffffffb90,
               level,(ConstevalFormatString<3U>)fmt,in_stack_fffffffffffffce0,
               in_stack_fffffffffffffce8,in_stack_fffffffffffffcf0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffb2e,
                        CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffb2e,
                        CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT26(in_stack_fffffffffffffb2e,
                        CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
    std::allocator<char>::~allocator(local_3c1);
  }
  std::unique_ptr<Sock,_std::default_delete<Sock>_>::~unique_ptr
            ((unique_ptr<Sock,_std::default_delete<Sock>_> *)in_stack_fffffffffffffb38);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT26(in_stack_fffffffffffffb2e,
                      CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
LAB_00910024:
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT26(in_stack_fffffffffffffb2e,
                      CONCAT24(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28)));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Session::CreateIfNotCreatedAlready()
{
    std::string errmsg;
    if (m_control_sock && m_control_sock->IsConnected(errmsg)) {
        return;
    }

    const auto session_type = m_transient ? "transient" : "persistent";
    const auto session_id = GetRandHash().GetHex().substr(0, 10); // full is overkill, too verbose in the logs

    LogPrintLevel(BCLog::I2P, BCLog::Level::Debug, "Creating %s SAM session %s with %s\n", session_type, session_id, m_control_host.ToString());

    auto sock = Hello();

    if (m_transient) {
        // The destination (private key) is generated upon session creation and returned
        // in the reply in DESTINATION=.
        const Reply& reply = SendRequestAndGetReply(
            *sock,
            strprintf("SESSION CREATE STYLE=STREAM ID=%s DESTINATION=TRANSIENT SIGNATURE_TYPE=7 "
                      "i2cp.leaseSetEncType=4,0 inbound.quantity=1 outbound.quantity=1",
                      session_id));

        m_private_key = DecodeI2PBase64(reply.Get("DESTINATION"));
    } else {
        // Read our persistent destination (private key) from disk or generate
        // one and save it to disk. Then use it when creating the session.
        const auto& [read_ok, data] = ReadBinaryFile(m_private_key_file);
        if (read_ok) {
            m_private_key.assign(data.begin(), data.end());
        } else {
            GenerateAndSavePrivateKey(*sock);
        }

        const std::string& private_key_b64 = SwapBase64(EncodeBase64(m_private_key));

        SendRequestAndGetReply(*sock,
                               strprintf("SESSION CREATE STYLE=STREAM ID=%s DESTINATION=%s "
                                         "i2cp.leaseSetEncType=4,0 inbound.quantity=3 outbound.quantity=3",
                                         session_id,
                                         private_key_b64));
    }

    m_my_addr = CService(DestBinToAddr(MyDestination()), I2P_SAM31_PORT);
    m_session_id = session_id;
    m_control_sock = std::move(sock);

    LogPrintLevel(BCLog::I2P, BCLog::Level::Info, "%s SAM session %s created, my address=%s\n",
        Capitalize(session_type),
        m_session_id,
        m_my_addr.ToStringAddrPort());
}